

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i64 fts5ExprSynonymRowid(Fts5ExprTerm *pTerm,int bDesc,int *pbEof)

{
  long lVar1;
  bool bVar2;
  i64 iVar3;
  
  bVar2 = false;
  iVar3 = 0;
  do {
    if (pTerm == (Fts5ExprTerm *)0x0) {
      if (!bVar2 && pbEof != (int *)0x0) {
        *pbEof = 1;
      }
      return iVar3;
    }
    if (pTerm->pIter->bEof == '\0') {
      lVar1 = pTerm->pIter->iRowid;
      if (bVar2) {
        bVar2 = true;
        if ((uint)(lVar1 < iVar3) == bDesc) goto LAB_00192b5e;
      }
      iVar3 = lVar1;
      bVar2 = true;
    }
LAB_00192b5e:
    pTerm = pTerm->pSynonym;
  } while( true );
}

Assistant:

static i64 fts5ExprSynonymRowid(Fts5ExprTerm *pTerm, int bDesc, int *pbEof){
  i64 iRet = 0;
  int bRetValid = 0;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  assert( bDesc==0 || bDesc==1 );
  for(p=pTerm; p; p=p->pSynonym){
    if( 0==sqlite3Fts5IterEof(p->pIter) ){
      i64 iRowid = p->pIter->iRowid;
      if( bRetValid==0 || (bDesc!=(iRowid<iRet)) ){
        iRet = iRowid;
        bRetValid = 1;
      }
    }
  }

  if( pbEof && bRetValid==0 ) *pbEof = 1;
  return iRet;
}